

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalGenerator::ConstructComment_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmCustomCommandGenerator *ccg,
          char *default_comment)

{
  pointer pcVar1;
  pointer pbVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  string *psVar5;
  pointer remote_path;
  string currentBinaryDir;
  string local_98;
  string local_78;
  cmStateDirectory local_58;
  
  pcVar3 = cmCustomCommandGenerator::GetComment(ccg);
  if (pcVar3 == (char *)0x0) {
    pvVar4 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar4->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar4->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x53c57b);
      cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
      psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_58);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + psVar5->_M_string_length);
      pvVar4 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
      remote_path = (pvVar4->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pvVar4->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (remote_path != pbVar2) {
        do {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
          cmStateDirectory::ConvertToRelPathIfNotContained
                    (&local_98,&local_58,&local_78,remote_path);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          remote_path = remote_path + 1;
        } while (remote_path != pbVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  else {
    default_comment = cmCustomCommandGenerator::GetComment(ccg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,default_comment,(allocator<char> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::ConstructComment(
  cmCustomCommandGenerator const& ccg, const char* default_comment)
{
  // Check for a comment provided with the command.
  if (ccg.GetComment()) {
    return ccg.GetComment();
  }

  // Construct a reasonable default comment if possible.
  if (!ccg.GetOutputs().empty()) {
    std::string comment;
    comment = "Generating ";
    const char* sep = "";
    std::string currentBinaryDir = this->GetCurrentBinaryDirectory();
    for (std::string const& o : ccg.GetOutputs()) {
      comment += sep;
      comment += this->MaybeConvertToRelativePath(currentBinaryDir, o);
      sep = ", ";
    }
    return comment;
  }

  // Otherwise use the provided default.
  return default_comment;
}